

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::DepthStencilCase::iterate(DepthStencilCase *this)

{
  QuadRenderer *pQVar1;
  ReferenceQuadRenderer *pRVar2;
  bool bVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  char *str;
  RenderTarget *pRVar8;
  PixelFormat *this_00;
  reference pvVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  size_type sVar12;
  reference pRVar13;
  pointer pRVar14;
  pointer pRVar15;
  RenderContext *context;
  char (*local_b70) [10];
  MessageBuilder local_a68;
  byte local_8e2;
  byte local_8e1;
  undefined1 local_8e0 [6];
  bool compareOk;
  bool isLastIter;
  PixelBufferAccess local_8b8;
  PixelBufferAccess local_890;
  PixelBufferAccess local_868;
  PixelBufferAccess local_840;
  PixelBufferAccess local_818;
  PixelBufferAccess local_7f0;
  __normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
  local_7c8;
  __normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
  local_7c0;
  __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
  local_7b8;
  const_iterator cmd_3;
  PixelBufferAccess local_788;
  PixelBufferAccess local_760;
  PixelBufferAccess local_738;
  PixelBufferAccess local_710;
  PixelBufferAccess local_6e8;
  PixelBufferAccess local_6c0;
  PixelBufferAccess local_698;
  PixelBufferAccess local_670;
  PixelBufferAccess local_648;
  PixelBufferAccess local_620;
  PixelBufferAccess local_5f8;
  __normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
  local_5d0;
  __normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
  local_5c8;
  __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
  local_5c0;
  const_iterator cmd_2;
  PixelBufferAccess local_590;
  undefined1 local_568 [8];
  RefRenderCommand refTestCmd;
  __normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>_>
  local_420;
  __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>_>
  local_418;
  const_iterator cmd_1;
  __normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>_>
  local_408;
  __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>_>
  local_400;
  const_iterator cmd;
  MessageBuilder local_278;
  WindowRectangle local_f8;
  Vector<bool,_4> local_e8;
  Vector<float,_4> local_e4;
  RGBA local_d4;
  undefined1 local_d0 [4];
  RGBA threshold;
  Surface renderedImg;
  RenderCommand testCmd;
  int viewportY;
  undefined1 local_28 [4];
  int viewportX;
  Random rnd;
  DepthStencilCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  dVar5 = ::deInt32Hash(this->m_iterNdx);
  de::Random::Random((Random *)local_28,dVar4 ^ dVar5);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = tcu::RenderTarget::getWidth(pRVar8);
  iVar6 = de::Random::getInt((Random *)local_28,0,iVar6 - (this->m_renderTarget).width);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = tcu::RenderTarget::getHeight(pRVar8);
  iVar7 = de::Random::getInt((Random *)local_28,0,iVar7 - (this->m_renderTarget).height);
  DepthStencilCaseUtil::RenderCommand::RenderCommand
            ((RenderCommand *)((long)&renderedImg.m_pixels.m_cap + 4));
  tcu::Surface::Surface
            ((Surface *)local_d0,(this->m_renderTarget).width,(this->m_renderTarget).height);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  this_00 = tcu::RenderTarget::getPixelFormat(pRVar8);
  local_d4 = tcu::PixelFormat::getColorThreshold(this_00);
  tcu::Vector<float,_4>::Vector(&local_e4,1.0,0.0,0.0,1.0);
  tcu::Vector<bool,_4>::Vector(&local_e8,true);
  rr::WindowRectangle::WindowRectangle
            (&local_f8,0,0,(this->m_renderTarget).width,(this->m_renderTarget).height);
  pvVar9 = std::
           vector<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ::operator[](&this->m_cases,(long)this->m_iterNdx);
  memcpy((void *)((long)&renderedImg.m_pixels.m_cap + 4),pvVar9,0x4d);
  if (this->m_iterNdx == 0) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_278,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_278,
                         (char (*) [77])
                         "Channels:\n  RED: passing pixels\n  GREEN: stencil values\n  BLUE: depth values"
                        );
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_278);
  }
  sVar12 = std::
           vector<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ::size(&this->m_cases);
  if (1 < sVar12) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&cmd,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<((MessageBuilder *)&cmd,(char (*) [11])"Iteration ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&this->m_iterNdx);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [4])0x128bd65);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&cmd);
  }
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pvVar9 = std::
           vector<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ::operator[](&this->m_cases,(long)this->m_iterNdx);
  DepthStencilCaseUtil::operator<<(pTVar10,pvVar9);
  DepthStencilCaseUtil::render(&this->m_baseClears,iVar6,iVar7);
  local_408._M_current =
       (RenderCommand *)
       std::
       vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
       ::begin(&this->m_baseDepthRenders);
  __gnu_cxx::
  __normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_const*,std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>>>
  ::__normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand*>
            ((__normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_const*,std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>>>
              *)&local_400,&local_408);
  while( true ) {
    cmd_1._M_current =
         (RenderCommand *)
         std::
         vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
         ::end(&this->m_baseDepthRenders);
    bVar3 = __gnu_cxx::operator!=
                      (&local_400,
                       (__normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>_>
                        *)&cmd_1);
    if (!bVar3) break;
    pQVar1 = this->m_renderer;
    pRVar13 = __gnu_cxx::
              __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>_>
              ::operator*(&local_400);
    DepthStencilCaseUtil::render(pQVar1,pRVar13,iVar6,iVar7);
    __gnu_cxx::
    __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>_>
    ::operator++(&local_400);
  }
  DepthStencilCaseUtil::render
            (this->m_renderer,(RenderCommand *)((long)&renderedImg.m_pixels.m_cap + 4),iVar6,iVar7);
  local_420._M_current =
       (RenderCommand *)
       std::
       vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
       ::begin(&this->m_visualizeCommands);
  __gnu_cxx::
  __normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_const*,std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>>>
  ::__normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand*>
            ((__normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_const*,std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>>>
              *)&local_418,&local_420);
  while( true ) {
    refTestCmd.state._152_8_ =
         std::
         vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
         ::end(&this->m_visualizeCommands);
    bVar3 = __gnu_cxx::operator!=
                      (&local_418,
                       (__normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>_>
                        *)&refTestCmd.state.colorMask);
    if (!bVar3) break;
    pQVar1 = this->m_renderer;
    pRVar13 = __gnu_cxx::
              __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>_>
              ::operator*(&local_418);
    DepthStencilCaseUtil::render(pQVar1,pRVar13,iVar6,iVar7);
    __gnu_cxx::
    __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>_>
    ::operator++(&local_418);
  }
  glwColorMask('\x01','\x01','\x01','\x01');
  glwDepthMask('\x01');
  glwStencilMask(0xffffffff);
  glwFlush();
  DepthStencilCaseUtil::RefRenderCommand::RefRenderCommand((RefRenderCommand *)local_568);
  DepthStencilCaseUtil::translateCommand
            ((RenderCommand *)((long)&renderedImg.m_pixels.m_cap + 4),(RefRenderCommand *)local_568,
             &this->m_renderTarget);
  tcu::Surface::getAccess(&local_590,this->m_refColorBuffer);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&cmd_2,this->m_refStencilBuffer);
  DepthStencilCaseUtil::renderReference
            (&this->m_baseClears,&local_590,(PixelBufferAccess *)&cmd_2,
             (this->m_renderTarget).stencilBits);
  local_5c8._M_current =
       (RefRenderCommand *)
       std::
       vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
       ::begin(&this->m_refBaseDepthRenders);
  __gnu_cxx::
  __normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_const*,std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>>>
  ::__normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand*>
            ((__normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_const*,std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>>>
              *)&local_5c0,&local_5c8);
  while( true ) {
    local_5d0._M_current =
         (RefRenderCommand *)
         std::
         vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
         ::end(&this->m_refBaseDepthRenders);
    bVar3 = __gnu_cxx::operator!=(&local_5c0,&local_5d0);
    if (!bVar3) break;
    pRVar2 = this->m_refRenderer;
    tcu::Surface::getAccess(&local_620,this->m_refColorBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_5f8,&local_620);
    tcu::TextureLevel::getAccess(&local_670,this->m_refDepthBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_648,&local_670);
    tcu::TextureLevel::getAccess(&local_6c0,this->m_refStencilBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_698,&local_6c0);
    pRVar14 = __gnu_cxx::
              __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
              ::operator->(&local_5c0);
    pRVar15 = __gnu_cxx::
              __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
              ::operator->(&local_5c0);
    deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
              (pRVar2,&local_5f8,&local_648,&local_698,&pRVar14->quad,&pRVar15->state);
    __gnu_cxx::
    __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
    ::operator++(&local_5c0);
  }
  pRVar2 = this->m_refRenderer;
  tcu::Surface::getAccess(&local_710,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_6e8,&local_710);
  tcu::TextureLevel::getAccess(&local_760,this->m_refDepthBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_738,&local_760);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&cmd_3,this->m_refStencilBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_788,(PixelBufferAccess *)&cmd_3);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar2,&local_6e8,&local_738,&local_788,(IntegerQuad *)local_568,
             (FragmentOperationState *)(refTestCmd.quad.depth + 2));
  local_7c0._M_current =
       (RefRenderCommand *)
       std::
       vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
       ::begin(&this->m_refVisualizeCommands);
  __gnu_cxx::
  __normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_const*,std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>>>
  ::__normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand*>
            ((__normal_iterator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_const*,std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>>>
              *)&local_7b8,&local_7c0);
  while( true ) {
    local_7c8._M_current =
         (RefRenderCommand *)
         std::
         vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
         ::end(&this->m_refVisualizeCommands);
    bVar3 = __gnu_cxx::operator!=(&local_7b8,&local_7c8);
    if (!bVar3) break;
    pRVar2 = this->m_refRenderer;
    tcu::Surface::getAccess(&local_818,this->m_refColorBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_7f0,&local_818);
    tcu::TextureLevel::getAccess(&local_868,this->m_refDepthBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_840,&local_868);
    tcu::TextureLevel::getAccess(&local_8b8,this->m_refStencilBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_890,&local_8b8);
    pRVar14 = __gnu_cxx::
              __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
              ::operator->(&local_7b8);
    pRVar15 = __gnu_cxx::
              __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
              ::operator->(&local_7b8);
    deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
              (pRVar2,&local_7f0,&local_840,&local_890,&pRVar14->quad,&pRVar15->state);
    __gnu_cxx::
    __normal_iterator<const_deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand_*,_std::vector<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>_>
    ::operator++(&local_7b8);
  }
  context = Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)local_8e0,(Surface *)local_d0);
  glu::readPixels(context,iVar6,iVar7,(PixelBufferAccess *)local_8e0);
  this->m_iterNdx = this->m_iterNdx + 1;
  iVar6 = this->m_iterNdx;
  sVar12 = std::
           vector<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ::size(&this->m_cases);
  local_8e1 = (int)sVar12 <= iVar6;
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  local_8e2 = tcu::pixelThresholdCompare
                        (pTVar10,"CompareResult","Image Comparison Result",this->m_refColorBuffer,
                         (Surface *)local_d0,&local_d4,COMPARE_LOG_RESULT);
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_a68,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  if ((local_8e2 & 1) == 0) {
    local_b70 = (char (*) [10])0x1283bc4;
  }
  else {
    local_b70 = (char (*) [10])0x1283bba;
  }
  pMVar11 = tcu::MessageBuilder::operator<<(&local_a68,local_b70);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a68);
  if ((local_8e2 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  if (((local_8e2 & 1) == 0) || ((local_8e1 & 1) != 0)) {
    this_local._4_4_ = STOP;
  }
  else {
    this_local._4_4_ = CONTINUE;
  }
  tcu::Surface::~Surface((Surface *)local_d0);
  de::Random::~Random((Random *)local_28);
  return this_local._4_4_;
}

Assistant:

DepthStencilCase::IterateResult DepthStencilCase::iterate (void)
{
	de::Random				rnd				(deStringHash(getName()) ^ deInt32Hash(m_iterNdx));
	int						viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth()-m_renderTarget.width);
	int						viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight()-m_renderTarget.height);
	RenderCommand			testCmd;

	tcu::Surface			renderedImg		(m_renderTarget.width, m_renderTarget.height);
	tcu::RGBA				threshold		= m_context.getRenderTarget().getPixelFormat().getColorThreshold();

	// Fill in test command for this iteration.
	testCmd.color		= Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	testCmd.colorMask	= tcu::BVec4(true);
	testCmd.rect		= rr::WindowRectangle(0, 0, m_renderTarget.width, m_renderTarget.height);
	testCmd.params		= m_cases[m_iterNdx];

	if (m_iterNdx == 0)
	{
		m_testCtx.getLog() << TestLog::Message << "Channels:\n"
													"  RED: passing pixels\n"
													"  GREEN: stencil values\n"
													"  BLUE: depth values"
							<< TestLog::EndMessage;
	}

	if (m_cases.size() > 1)
		m_testCtx.getLog() << TestLog::Message << "Iteration " << m_iterNdx << "..." << TestLog::EndMessage;

	m_testCtx.getLog() << m_cases[m_iterNdx];

	// Submit render commands to gl GL.

	// Base clears.
	render(m_baseClears, viewportX, viewportY);

	// Base depths.
	for (vector<RenderCommand>::const_iterator cmd = m_baseDepthRenders.begin(); cmd != m_baseDepthRenders.end(); ++cmd)
		render(*m_renderer, *cmd, viewportX, viewportY);

	// Test command.
	render(*m_renderer, testCmd, viewportX, viewportY);

	// Visualization commands.
	for (vector<RenderCommand>::const_iterator cmd = m_visualizeCommands.begin(); cmd != m_visualizeCommands.end(); ++cmd)
		render(*m_renderer, *cmd, viewportX, viewportY);

	// Re-enable all write masks.
	glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	glDepthMask(GL_TRUE);
	glStencilMask(~0u);

	// Ask GPU to start rendering.
	glFlush();

	// Render reference while GPU is doing work.
	{
		RefRenderCommand refTestCmd;
		translateCommand(testCmd, refTestCmd, m_renderTarget);

		// Base clears.
		renderReference(m_baseClears, m_refColorBuffer->getAccess(), m_refStencilBuffer->getAccess(), m_renderTarget.stencilBits);

		// Base depths.
		for (vector<RefRenderCommand>::const_iterator cmd = m_refBaseDepthRenders.begin(); cmd != m_refBaseDepthRenders.end(); ++cmd)
			m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
								  cmd->quad, cmd->state);

		// Test command.
		m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
							  refTestCmd.quad, refTestCmd.state);

		// Visualization commands.
		for (vector<RefRenderCommand>::const_iterator cmd = m_refVisualizeCommands.begin(); cmd != m_refVisualizeCommands.end(); ++cmd)
			m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
								  cmd->quad, cmd->state);
	}

	// Read rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	m_iterNdx += 1;

	// Compare to reference.
	bool	isLastIter	= m_iterNdx >= (int)m_cases.size();
	bool	compareOk	= tcu::pixelThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result", *m_refColorBuffer, renderedImg, threshold,
													 tcu::COMPARE_LOG_RESULT);

	m_testCtx.getLog() << TestLog::Message << (compareOk ? "  Passed." : "  FAILED!") << TestLog::EndMessage;
	if (!compareOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	if (compareOk && !isLastIter)
		return CONTINUE;
	else
		return STOP;
}